

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zdrot(int n,complex<double> *cx,int incx,complex<double> *cy,int incy,double c,double s)

{
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar1;
  undefined4 uVar2;
  complex<double> local_120;
  complex<double> local_110;
  undefined8 local_f8;
  complex<double> local_f0;
  complex<double> local_e0 [2];
  complex<double> local_c0;
  complex<double> local_b0;
  undefined8 local_98;
  complex<double> local_90;
  complex<double> local_80 [2];
  int local_5c;
  int local_58;
  int iy;
  int ix;
  int i;
  complex<double> ctemp;
  double s_local;
  double c_local;
  complex<double> *pcStack_28;
  int incy_local;
  complex<double> *cy_local;
  complex<double> *pcStack_18;
  int incx_local;
  complex<double> *cx_local;
  int n_local;
  
  uVar1 = 0;
  uVar2 = 0;
  ctemp._M_value._8_8_ = s;
  s_local = c;
  c_local._4_4_ = incy;
  pcStack_28 = cy;
  cy_local._4_4_ = incx;
  pcStack_18 = cx;
  cx_local._4_4_ = n;
  std::complex<double>::complex((complex<double> *)&ix,0.0,0.0);
  if (0 < cx_local._4_4_) {
    if ((cy_local._4_4_ == 1) && (c_local._4_4_ == 1)) {
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(&s_local,pcStack_18 + iy);
        local_80[0]._M_value._12_4_ = uVar2;
        local_80[0]._M_value._8_4_ = uVar1;
        std::operator*((double *)(ctemp._M_value + 8),pcStack_28 + iy);
        local_90._M_value._12_4_ = uVar2;
        local_90._M_value._8_4_ = uVar1;
        std::operator+(local_80,&local_90);
        unique0x10000091 = extraout_XMM0_Db;
        ix = extraout_XMM0_Da;
        local_80[1]._M_value._12_4_ = uVar2;
        local_80[1]._M_value._8_4_ = uVar1;
        ctemp._M_value._0_8_ = local_80[1]._M_value._8_8_;
        std::operator*(&s_local,pcStack_28 + iy);
        local_b0._M_value._12_4_ = uVar2;
        local_b0._M_value._8_4_ = uVar1;
        std::operator*((double *)(ctemp._M_value + 8),pcStack_18 + iy);
        local_c0._M_value._12_4_ = uVar2;
        local_c0._M_value._8_4_ = uVar1;
        std::operator-(&local_b0,&local_c0);
        local_98 = CONCAT44(uVar2,uVar1);
        *(ulong *)pcStack_28[iy]._M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        *(undefined8 *)(pcStack_28[iy]._M_value + 8) = local_98;
        *(undefined8 *)pcStack_18[iy]._M_value = _ix;
        *(undefined8 *)(pcStack_18[iy]._M_value + 8) = ctemp._M_value._0_8_;
      }
    }
    else {
      if (cy_local._4_4_ < 0) {
        local_58 = (1 - cx_local._4_4_) * cy_local._4_4_;
      }
      else {
        local_58 = 0;
      }
      if (c_local._4_4_ < 0) {
        local_5c = (1 - cx_local._4_4_) * c_local._4_4_;
      }
      else {
        local_5c = 0;
      }
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(&s_local,pcStack_18 + local_58);
        local_e0[0]._M_value._12_4_ = uVar2;
        local_e0[0]._M_value._8_4_ = uVar1;
        std::operator*((double *)(ctemp._M_value + 8),pcStack_28 + local_5c);
        local_f0._M_value._12_4_ = uVar2;
        local_f0._M_value._8_4_ = uVar1;
        std::operator+(local_e0,&local_f0);
        unique0x100000c1 = extraout_XMM0_Db_01;
        ix = extraout_XMM0_Da_01;
        local_e0[1]._M_value._12_4_ = uVar2;
        local_e0[1]._M_value._8_4_ = uVar1;
        ctemp._M_value._0_8_ = local_e0[1]._M_value._8_8_;
        std::operator*(&s_local,pcStack_28 + local_5c);
        local_110._M_value._12_4_ = uVar2;
        local_110._M_value._8_4_ = uVar1;
        std::operator*((double *)(ctemp._M_value + 8),pcStack_18 + local_58);
        local_120._M_value._12_4_ = uVar2;
        local_120._M_value._8_4_ = uVar1;
        std::operator-(&local_110,&local_120);
        local_f8 = CONCAT44(uVar2,uVar1);
        *(ulong *)pcStack_28[local_5c]._M_value = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        *(undefined8 *)(pcStack_28[local_5c]._M_value + 8) = local_f8;
        *(undefined8 *)pcStack_18[local_58]._M_value = _ix;
        *(undefined8 *)(pcStack_18[local_58]._M_value + 8) = ctemp._M_value._0_8_;
        local_58 = local_58 + cy_local._4_4_;
        local_5c = local_5c + c_local._4_4_;
      }
    }
  }
  return;
}

Assistant:

void zdrot ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy, double c, double s )

//****************************************************************************80
//
//  Purpose:
//
//    ZDROT applies a plane rotation to complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The cosine C and sine S are real and the vectors CX and CY are complex.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <double> CX[], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of CY.
//
//    Input, double C, S, parameters (presumably the cosine and sine of
//    some angle) that define a plane rotation.
//
{
  complex <double> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = c * cx[i] + s * cy[i];
      cy[i] = c * cy[i] - s * cx[i];
      cx[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp  = c * cx[ix] + s * cy[iy];
      cy[iy] = c * cy[iy] - s * cx[ix];
      cx[ix] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}